

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

void Ree_ManComputeCutsTest(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vAdds;
  long lVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar2 = Ree_ManCountFadds(vAdds);
  Ree_ManPrintAdders(vAdds,1);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar2,(ulong)(vAdds->nSize / 6 - uVar2));
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
    vAdds->pArray = (int *)0x0;
  }
  if (vAdds != (Vec_Int_t *)0x0) {
    free(vAdds);
  }
  level = 3;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  return;
}

Assistant:

void Ree_ManComputeCutsTest( Gia_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Vec_IntFree( vAdds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}